

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O1

void __thiscall
ninx::parser::element::FunctionArgument::FunctionArgument
          (FunctionArgument *this,string *name,
          unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
          *default_value)

{
  pointer pcVar1;
  
  (this->super_ASTElement).parent = (Block *)0x0;
  (this->super_ASTElement).__output_block = (Block *)0x0;
  (this->super_ASTElement)._vptr_ASTElement = (_func_int **)&PTR__FunctionArgument_001503b8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  (this->default_value)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (default_value->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (default_value->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (Expression *)0x0;
  return;
}

Assistant:

ninx::parser::element::FunctionArgument::FunctionArgument(const std::string &name,
                                                          std::unique_ptr<ninx::parser::element::Expression> default_value)
        : name(name), default_value(std::move(default_value)) {}